

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newline_string.c
# Opt level: O2

char * mpt_newline_string(int type)

{
  char *pcVar1;
  
  pcVar1 = "\r\n";
  if (type == 1) {
    pcVar1 = "\r";
  }
  if (type == 2) {
    pcVar1 = "\n";
  }
  if (type < 1) {
    pcVar1 = "\n";
  }
  return pcVar1;
}

Assistant:

extern const char *mpt_newline_string(int type)
{
	static const char nl_unix[] = { '\n', 0 };
	static const char nl_mac[] = { '\r', 0 };
	static const char nl_net[] = { '\r', '\n', 0 };
	const char *nl = nl_net;
	
	if (type < 0 || !type) {
		type = mpt_newline_native();
	}
	if (type == MPT_ENUM(NewlineUnix)) {
		nl = nl_unix;
	}
	if (type == MPT_ENUM(NewlineMac)) {
		nl = nl_mac;
	}
	return nl;
}